

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcts.h
# Opt level: O0

unique_ptr<MCTS::Node<ConnectFourState>,_std::default_delete<MCTS::Node<ConnectFourState>_>_>
MCTS::compute_tree<ConnectFourState>
          (ConnectFourState *root_state,ComputeOptions options,result_type initial_seed)

{
  runtime_error *this;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *this_00;
  int *in_RSI;
  _Head_base<0UL,_MCTS::Node<ConnectFourState>_*,_false> in_RDI;
  bool bVar1;
  Move move;
  pointer node;
  int iter;
  ConnectFourState state;
  mt19937_64 random_engine;
  unique_ptr<MCTS::Node<ConnectFourState>,_std::default_delete<MCTS::Node<ConnectFourState>_>_>
  *root;
  pointer in_stack_fffffffffffff558;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *in_stack_fffffffffffff560;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *in_stack_fffffffffffff568;
  undefined7 in_stack_fffffffffffff570;
  undefined1 in_stack_fffffffffffff577;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *in_stack_fffffffffffff578;
  Move in_stack_fffffffffffff580;
  undefined4 in_stack_fffffffffffff584;
  bool local_a6b;
  Node<ConnectFourState> *in_stack_fffffffffffff5a0;
  ConnectFourState *this_01;
  undefined4 in_stack_fffffffffffff5c8;
  Move MVar2;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *pmVar3;
  int local_a24;
  int in_stack_fffffffffffff7b4;
  char *in_stack_fffffffffffff7b8;
  char *in_stack_fffffffffffff7c0;
  
  this_01 = (ConnectFourState *)&stack0x00000008;
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::mersenne_twister_engine(in_stack_fffffffffffff560,(result_type)in_stack_fffffffffffff558);
  if ((this_01->num_rows < 0) && (*(double *)&this_01->num_cols < 0.0)) {
    assertion_failed(in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b4);
  }
  if (0.0 <= *(double *)&this_01->num_cols) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"ComputeOptions::max_time requires OpenMP.");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((*in_RSI != 1) && (*in_RSI != 2)) {
    assertion_failed(in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b4);
  }
  operator_new(0x60);
  Node<ConnectFourState>::Node
            ((Node<ConnectFourState> *)in_stack_fffffffffffff560,
             (ConnectFourState *)in_stack_fffffffffffff558);
  std::unique_ptr<MCTS::Node<ConnectFourState>,std::default_delete<MCTS::Node<ConnectFourState>>>::
  unique_ptr<std::default_delete<MCTS::Node<ConnectFourState>>,void>
            ((unique_ptr<MCTS::Node<ConnectFourState>,_std::default_delete<MCTS::Node<ConnectFourState>_>_>
              *)in_stack_fffffffffffff560,in_stack_fffffffffffff558);
  ConnectFourState::ConnectFourState(this_01,SUB84(in_RDI._M_head_impl,4),(int)in_RDI._M_head_impl);
  local_a24 = 1;
  while( true ) {
    bVar1 = true;
    if (this_01->num_rows < local_a24) {
      bVar1 = this_01->num_rows < 0;
    }
    if (!bVar1) break;
    this_00 = (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
               *)std::
                 unique_ptr<MCTS::Node<ConnectFourState>,_std::default_delete<MCTS::Node<ConnectFourState>_>_>
                 ::get((unique_ptr<MCTS::Node<ConnectFourState>,_std::default_delete<MCTS::Node<ConnectFourState>_>_>
                        *)in_stack_fffffffffffff560);
    ConnectFourState::operator=
              ((ConnectFourState *)in_stack_fffffffffffff560,
               (ConnectFourState *)in_stack_fffffffffffff558);
    while( true ) {
      bVar1 = Node<ConnectFourState>::has_untried_moves((Node<ConnectFourState> *)0x135585);
      local_a6b = false;
      if (!bVar1) {
        local_a6b = Node<ConnectFourState>::has_children((Node<ConnectFourState> *)0x1355a6);
      }
      if (local_a6b == false) break;
      this_00 = (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                 *)Node<ConnectFourState>::select_child_UCT(in_stack_fffffffffffff5a0);
      ConnectFourState::do_move
                ((ConnectFourState *)CONCAT17(in_stack_fffffffffffff577,in_stack_fffffffffffff570),
                 (Move)((ulong)in_stack_fffffffffffff568 >> 0x20));
    }
    bVar1 = Node<ConnectFourState>::has_untried_moves((Node<ConnectFourState> *)0x135662);
    in_stack_fffffffffffff584 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff584);
    if (bVar1) {
      in_stack_fffffffffffff580 =
           Node<ConnectFourState>::
           get_untried_move<std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                     ((Node<ConnectFourState> *)
                      CONCAT44(in_stack_fffffffffffff584,in_stack_fffffffffffff580),
                      in_stack_fffffffffffff578);
      MVar2 = in_stack_fffffffffffff580;
      ConnectFourState::do_move
                ((ConnectFourState *)CONCAT17(in_stack_fffffffffffff577,in_stack_fffffffffffff570),
                 (Move)((ulong)in_stack_fffffffffffff568 >> 0x20));
      in_stack_fffffffffffff578 =
           (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
            *)Node<ConnectFourState>::add_child
                        ((Node<ConnectFourState> *)this_00,
                         (Move *)CONCAT44(MVar2,in_stack_fffffffffffff5c8),this_01);
      this_00 = in_stack_fffffffffffff578;
    }
    while (in_stack_fffffffffffff577 =
                ConnectFourState::has_moves((ConnectFourState *)in_stack_fffffffffffff568),
          (bool)in_stack_fffffffffffff577) {
      ConnectFourState::
      do_random_move<std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                ((ConnectFourState *)CONCAT17(in_stack_fffffffffffff577,in_stack_fffffffffffff570),
                 in_stack_fffffffffffff568);
    }
    while (this_00 !=
           (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
            *)0x0) {
      pmVar3 = this_00;
      in_stack_fffffffffffff568 =
           (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
            *)ConnectFourState::get_result
                        ((ConnectFourState *)in_stack_fffffffffffff568,(int)((ulong)this_00 >> 0x20)
                        );
      Node<ConnectFourState>::update
                ((Node<ConnectFourState> *)this_00,(double)in_stack_fffffffffffff568);
      in_stack_fffffffffffff560 = this_00;
      this_00 = (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                 *)pmVar3->_M_x[1];
    }
    local_a24 = local_a24 + 1;
  }
  ConnectFourState::~ConnectFourState((ConnectFourState *)0x135780);
  return (__uniq_ptr_data<MCTS::Node<ConnectFourState>,_std::default_delete<MCTS::Node<ConnectFourState>_>,_true,_true>
          )(tuple<MCTS::Node<ConnectFourState>_*,_std::default_delete<MCTS::Node<ConnectFourState>_>_>
            )in_RDI._M_head_impl;
}

Assistant:

std::unique_ptr<Node<State>>  compute_tree(const State root_state,
                                           const ComputeOptions options,
                                           std::mt19937_64::result_type initial_seed)
{
	std::mt19937_64 random_engine(initial_seed);

	attest(options.max_iterations >= 0 || options.max_time >= 0);
	if (options.max_time >= 0) {
		#ifndef USE_OPENMP
		throw std::runtime_error("ComputeOptions::max_time requires OpenMP.");
		#endif
	}
	// Will support more players later.
	attest(root_state.player_to_move == 1 || root_state.player_to_move == 2);
	auto root = std::unique_ptr<Node<State>>(new Node<State>(root_state));

	#ifdef USE_OPENMP
	double start_time = ::omp_get_wtime();
	double print_time = start_time;
	#endif

	State state;
	for (int iter = 1; iter <= options.max_iterations || options.max_iterations < 0; ++iter) {
		auto node = root.get();
		state = root_state;

		// Select a path through the tree to a leaf node.
		while (!node->has_untried_moves() && node->has_children()) {
			node = node->select_child_UCT();
			state.do_move(node->move);
		}

		// If we are not already at the final state, expand the
		// tree with a new node and move there.
		if (node->has_untried_moves()) {
			auto move = node->get_untried_move(&random_engine);
			state.do_move(move);
			node = node->add_child(move, state);
		}

		// We now play randomly until the game ends.
		while (state.has_moves()) {
			state.do_random_move(&random_engine);
		}

		// We have now reached a final state. Backpropagate the result
		// up the tree to the root node.
		while (node != nullptr) {
			node->update(state.get_result(node->player_to_move));
			node = node->parent;
		}

		#ifdef USE_OPENMP
		if (options.verbose || options.max_time >= 0) {
			double time = ::omp_get_wtime();
			if (options.verbose && (time - print_time >= 1.0 || iter == options.max_iterations)) {
				std::cerr << iter << " games played (" << double(iter) / (time - start_time) << " / second)." << endl;
				print_time = time;
			}

			if (time - start_time >= options.max_time) {
				break;
			}
		}
		#endif
	}

	return root;
}